

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_part.cpp
# Opt level: O1

long duckdb::DatePart::PartOperator<duckdb::DatePart::CenturyOperator>::
     Operation<duckdb::timestamp_t,long>
               (timestamp_t input,ValidityMask *mask,idx_t idx,void *dataptr)

{
  ulong *puVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  byte bVar2;
  ulong uVar3;
  element_type *peVar4;
  bool bVar5;
  int32_t iVar6;
  long lVar7;
  TemplatedValidityData<unsigned_long> *pTVar8;
  duckdb local_38 [4];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_30;
  idx_t local_20;
  
  bVar5 = Value::IsFinite<duckdb::timestamp_t>(input);
  if (bVar5) {
    Timestamp::GetDate(input);
    uVar3 = (ulong)_local_38 >> 0x20;
    iVar6 = Date::ExtractYear((date_t)(int32_t)uVar3);
    if (iVar6 < 1) {
      lVar7 = (long)iVar6 / 100 + -1;
    }
    else {
      lVar7 = ((long)iVar6 - 1U) / 100 + 1;
    }
  }
  else {
    if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
      local_20 = (mask->super_TemplatedValidityMask<unsigned_long>).capacity;
      make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>(local_38,&local_20);
      peVar4 = _local_38;
      _local_38 = (element_type *)0x0;
      this = (mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
             super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi;
      (mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = peVar4;
      (mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = p_Stack_30;
      if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
      }
      pTVar8 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                         (&(mask->super_TemplatedValidityMask<unsigned_long>).validity_data);
      (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask =
           (unsigned_long *)
           (pTVar8->owned_data).
           super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
           super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
           super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
           super__Head_base<0UL,_unsigned_long_*,_false>;
    }
    bVar2 = (byte)idx & 0x3f;
    puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask + (idx >> 6);
    *puVar1 = *puVar1 & (-2L << bVar2 | 0xfffffffffffffffeU >> 0x40 - bVar2);
    lVar7 = 0;
  }
  return lVar7;
}

Assistant:

static inline TR Operation(TA input, ValidityMask &mask, idx_t idx, void *dataptr) {
			if (Value::IsFinite(input)) {
				return OP::template Operation<TA, TR>(input);
			} else {
				mask.SetInvalid(idx);
				return TR();
			}
		}